

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall icu_63::DecimalFormat::DecimalFormat(DecimalFormat *this,UErrorCode *status)

{
  Locale *pLVar1;
  NumberingSystem *this_00;
  char *pcVar2;
  char16_t *text;
  UnicodeString patternString;
  UnicodeString local_140;
  Locale local_100;
  
  DecimalFormat(this,(DecimalFormatSymbols *)0x0,status);
  pLVar1 = Locale::getDefault();
  pcVar2 = pLVar1->fullName;
  this_00 = NumberingSystem::createInstance(status);
  Locale::Locale(&local_100,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0);
  pcVar2 = NumberingSystem::getName(this_00);
  text = icu_63::number::impl::utils::getPatternForStyle
                   (&local_100,pcVar2,CLDR_PATTERN_STYLE_DECIMAL,status);
  UnicodeString::UnicodeString(&local_140,text);
  Locale::~Locale(&local_100);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::number::impl::PatternParser::parseToExistingProperties
              (&local_140,
               (this->fields->properties).
               super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
               IGNORE_ROUNDING_IF_CURRENCY,status);
  }
  touch(this,status);
  UnicodeString::~UnicodeString(&local_140);
  (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(UErrorCode& status)
        : DecimalFormat(nullptr, status) {
    // Use the default locale and decimal pattern.
    const char* localeName = Locale::getDefault().getName();
    LocalPointer<NumberingSystem> ns(NumberingSystem::createInstance(status));
    UnicodeString patternString = utils::getPatternForStyle(
            localeName,
            ns->getName(),
            CLDR_PATTERN_STYLE_DECIMAL,
            status);
    setPropertiesFromPattern(patternString, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}